

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * __thiscall
mjs::interpreter::impl::operator()(value *__return_storage_ptr__,impl *this,binary_expression *e)

{
  uint32_t *__return_storage_ptr___00;
  bool bVar1;
  token_type tVar2;
  int iVar3;
  value_type vVar4;
  expression *peVar5;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar6;
  native_error_exception *pnVar7;
  object_ptr *poVar8;
  object *poVar9;
  global_object *pgVar10;
  object *poVar11;
  wostream *os;
  undefined1 local_840 [16];
  undefined1 local_830 [8];
  object_ptr v;
  wstring local_818 [32];
  wstring_view local_7f8;
  wstring local_7e8;
  wstring_view local_7c8;
  wostringstream local_7b8 [8];
  wostringstream woss_2;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_640;
  undefined1 local_630 [8];
  value o;
  wstring local_600 [32];
  wstring_view local_5e0;
  wstring local_5d0;
  wstring_view local_5b0;
  wostringstream local_5a0 [8];
  wostringstream woss_1;
  gc_heap_ptr<mjs::object> local_420;
  byte local_409;
  undefined1 local_408 [16];
  string local_3f8;
  wstring_view local_3e8;
  undefined1 local_3d1;
  wstring local_3d0 [32];
  wstring_view local_3b0;
  wstring local_3a0;
  wstring_view local_380;
  wostringstream local_370 [8];
  wostringstream woss;
  value local_1f8;
  undefined1 local_1d0 [8];
  value r;
  value local_1a0;
  undefined1 local_178 [8];
  value l;
  undefined1 local_128 [8];
  value lval;
  undefined1 local_d0 [8];
  value l_1;
  value local_70;
  value local_48;
  binary_expression *local_20;
  binary_expression *e_local;
  impl *this_local;
  value *r_1;
  
  local_20 = e;
  e_local = (binary_expression *)this;
  this_local = (impl *)__return_storage_ptr__;
  tVar2 = binary_expression::op(e);
  if (tVar2 == comma) {
    peVar5 = binary_expression::lhs(local_20);
    eval(&local_70,this,peVar5);
    get_value(&local_48,this,&local_70);
    value::~value(&local_48);
    value::~value(&local_70);
    peVar5 = binary_expression::rhs(local_20);
    __return_storage_ptr___00 =
         &l_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
          pos_;
    eval((value *)__return_storage_ptr___00,this,peVar5);
    get_value(__return_storage_ptr__,this,(value *)__return_storage_ptr___00);
    value::~value((value *)&l_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                            super_gc_heap_ptr_untyped.pos_);
  }
  else {
    tVar2 = binary_expression::op(local_20);
    iVar3 = operator_precedence(tVar2);
    if (iVar3 == 0xf) {
      peVar5 = binary_expression::lhs(local_20);
      eval((value *)local_d0,this,peVar5);
      peVar5 = binary_expression::rhs(local_20);
      eval((value *)&lval.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                     super_gc_heap_ptr_untyped.pos_,this,peVar5);
      get_value(__return_storage_ptr__,this,
                (value *)&lval.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                          super_gc_heap_ptr_untyped.pos_);
      value::~value((value *)&lval.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.pos_);
      tVar2 = binary_expression::op(local_20);
      if (tVar2 != equal) {
        get_value((value *)local_128,this,(value *)local_d0);
        tVar2 = binary_expression::op(local_20);
        tVar2 = without_assignment(tVar2);
        do_binary_op((value *)&l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_,this,tVar2,(value *)local_128,
                     __return_storage_ptr__);
        value::operator=(__return_storage_ptr__,
                         (value *)&l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                                   super_gc_heap_ptr_untyped.pos_);
        value::~value((value *)&l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                                super_gc_heap_ptr_untyped.pos_);
        value::~value((value *)local_128);
      }
      put_value(this,(value *)local_d0,__return_storage_ptr__);
      value::~value((value *)local_d0);
    }
    else {
      peVar5 = binary_expression::lhs(local_20);
      eval(&local_1a0,this,peVar5);
      get_value((value *)local_178,this,&local_1a0);
      value::~value(&local_1a0);
      tVar2 = binary_expression::op(local_20);
      if (((tVar2 == andand) && (bVar1 = to_boolean((value *)local_178), !bVar1)) ||
         ((tVar2 = binary_expression::op(local_20), tVar2 == oror &&
          (bVar1 = to_boolean((value *)local_178), bVar1)))) {
        value::value(__return_storage_ptr__,(value *)local_178);
        r.field_1._28_4_ = 1;
      }
      else {
        peVar5 = binary_expression::rhs(local_20);
        eval(&local_1f8,this,peVar5);
        get_value((value *)local_1d0,this,&local_1f8);
        value::~value(&local_1f8);
        tVar2 = binary_expression::op(local_20);
        if ((tVar2 == andand) || (tVar2 = binary_expression::op(local_20), tVar2 == oror)) {
          value::value(__return_storage_ptr__,(value *)local_1d0);
          r.field_1._28_4_ = 1;
        }
        else {
          tVar2 = binary_expression::op(local_20);
          bVar1 = is_reference_op(tVar2);
          if (bVar1) {
            make_reference(__return_storage_ptr__,this,(value *)local_178,(value *)local_1d0);
            r.field_1._28_4_ = 1;
          }
          else {
            tVar2 = binary_expression::op(local_20);
            if (tVar2 == in_) {
              vVar4 = value::type((value *)local_1d0);
              if (vVar4 != object) {
                std::__cxx11::wostringstream::wostringstream(local_370);
                vVar4 = value::type((value *)local_1d0);
                pbVar6 = mjs::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)
                                         local_370,vVar4);
                std::operator<<(pbVar6," is not an object");
                local_3d1 = 1;
                pnVar7 = (native_error_exception *)__cxa_allocate_exception(0x58);
                stack_trace_abi_cxx11_(&local_3a0,this);
                local_380 = (wstring_view)
                            std::__cxx11::wstring::operator_cast_to_basic_string_view
                                      ((wstring *)&local_3a0);
                std::__cxx11::wostringstream::str();
                local_3b0 = (wstring_view)
                            std::__cxx11::wstring::operator_cast_to_basic_string_view(local_3d0);
                native_error_exception::native_error_exception(pnVar7,type,&local_380,&local_3b0);
                local_3d1 = 0;
                __cxa_throw(pnVar7,&native_error_exception::typeinfo,
                            native_error_exception::~native_error_exception);
              }
              poVar8 = value::object_value((value *)local_1d0);
              poVar9 = gc_heap_ptr<mjs::object>::operator->(poVar8);
              to_string((mjs *)&local_3f8,this->heap_,(value *)local_178);
              local_3e8 = string::view(&local_3f8);
              bVar1 = object::has_property(poVar9,&local_3e8);
              value::value(__return_storage_ptr__,bVar1);
              string::~string(&local_3f8);
              r.field_1._28_4_ = 1;
            }
            else {
              tVar2 = binary_expression::op(local_20);
              if (tVar2 == instanceof_) {
                vVar4 = value::type((value *)local_1d0);
                local_409 = 0;
                bVar1 = true;
                if (vVar4 == object) {
                  poVar8 = value::object_value((value *)local_1d0);
                  gc_heap_ptr<mjs::object>::operator->(poVar8);
                  object::prototype((object *)local_408);
                  local_409 = 1;
                  poVar9 = gc_heap_ptr<mjs::object>::get((gc_heap_ptr<mjs::object> *)local_408);
                  pgVar10 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
                  (*(pgVar10->super_object)._vptr_object[0xc])(&local_420);
                  poVar11 = gc_heap_ptr<mjs::object>::get(&local_420);
                  bVar1 = poVar9 != poVar11;
                  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_420);
                }
                if ((local_409 & 1) != 0) {
                  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_408);
                }
                if (bVar1) {
                  std::__cxx11::wostringstream::wostringstream(local_5a0);
                  vVar4 = value::type((value *)local_1d0);
                  pbVar6 = mjs::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)
                                           local_5a0,vVar4);
                  std::operator<<(pbVar6," is not an object");
                  o.field_1.field5[0x1f] = 1;
                  pnVar7 = (native_error_exception *)__cxa_allocate_exception(0x58);
                  stack_trace_abi_cxx11_(&local_5d0,this);
                  local_5b0 = (wstring_view)
                              std::__cxx11::wstring::operator_cast_to_basic_string_view
                                        ((wstring *)&local_5d0);
                  std::__cxx11::wostringstream::str();
                  local_5e0 = (wstring_view)
                              std::__cxx11::wstring::operator_cast_to_basic_string_view(local_600);
                  native_error_exception::native_error_exception(pnVar7,type,&local_5b0,&local_5e0);
                  o.field_1.field5[0x1f] = 0;
                  __cxa_throw(pnVar7,&native_error_exception::typeinfo,
                              native_error_exception::~native_error_exception);
                }
                vVar4 = value::type((value *)local_178);
                if (vVar4 == object) {
                  poVar8 = value::object_value((value *)local_1d0);
                  poVar9 = gc_heap_ptr<mjs::object>::operator->(poVar8);
                  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                            (&local_640,L"prototype");
                  (**poVar9->_vptr_object)(local_630,poVar9,&local_640);
                  vVar4 = value::type((value *)local_630);
                  if (vVar4 != object) {
                    std::__cxx11::wostringstream::wostringstream(local_7b8);
                    os = std::operator<<((wostream *)local_7b8,
                                         "Function has non-object prototype of type ");
                    vVar4 = value::type((value *)local_630);
                    pbVar6 = mjs::operator<<(os,vVar4);
                    std::operator<<(pbVar6," in instanceof check");
                    v.super_gc_heap_ptr_untyped._15_1_ = 1;
                    pnVar7 = (native_error_exception *)__cxa_allocate_exception(0x58);
                    stack_trace_abi_cxx11_(&local_7e8,this);
                    local_7c8 = (wstring_view)
                                std::__cxx11::wstring::operator_cast_to_basic_string_view
                                          ((wstring *)&local_7e8);
                    std::__cxx11::wostringstream::str();
                    local_7f8 = (wstring_view)
                                std::__cxx11::wstring::operator_cast_to_basic_string_view(local_818)
                    ;
                    native_error_exception::native_error_exception
                              (pnVar7,type,&local_7c8,&local_7f8);
                    v.super_gc_heap_ptr_untyped._15_1_ = 0;
                    __cxa_throw(pnVar7,&native_error_exception::typeinfo,
                                native_error_exception::~native_error_exception);
                  }
                  poVar8 = value::object_value((value *)local_178);
                  gc_heap_ptr<mjs::object>::operator->(poVar8);
                  object::prototype((object *)local_830);
                  while (bVar1 = gc_heap_ptr_untyped::operator_cast_to_bool
                                           ((gc_heap_ptr_untyped *)local_830), bVar1) {
                    poVar9 = gc_heap_ptr<mjs::object>::get((gc_heap_ptr<mjs::object> *)local_830);
                    poVar8 = value::object_value((value *)local_630);
                    poVar11 = gc_heap_ptr<mjs::object>::get(poVar8);
                    if (poVar9 == poVar11) {
                      value::value(__return_storage_ptr__,true);
                      goto LAB_001370d5;
                    }
                    gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_830);
                    object::prototype((object *)local_840);
                    gc_heap_ptr<mjs::object>::operator=
                              ((gc_heap_ptr<mjs::object> *)local_830,
                               (gc_heap_ptr<mjs::object> *)local_840);
                    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_840);
                  }
                  value::value(__return_storage_ptr__,false);
LAB_001370d5:
                  r.field_1._28_4_ = 1;
                  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_830);
                  value::~value((value *)local_630);
                }
                else {
                  value::value(__return_storage_ptr__,false);
                  r.field_1._28_4_ = 1;
                }
              }
              else {
                tVar2 = binary_expression::op(local_20);
                do_binary_op(__return_storage_ptr__,this,tVar2,(value *)local_178,(value *)local_1d0
                            );
                r.field_1._28_4_ = 1;
              }
            }
          }
        }
        value::~value((value *)local_1d0);
      }
      value::~value((value *)local_178);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

value operator()(const binary_expression& e) {
        if (e.op() == token_type::comma) {
            (void)get_value(eval(e.lhs()));;
            return get_value(eval(e.rhs()));
        }
        if (operator_precedence(e.op()) == assignment_precedence) {
            auto l = eval(e.lhs());
            auto r = get_value(eval(e.rhs()));
            if (e.op() != token_type::equal) {
                auto lval = get_value(l);
                r = do_binary_op(without_assignment(e.op()), lval, r);
            }
            put_value(l, r);
            return r;
        }

        auto l = get_value(eval(e.lhs()));
        if ((e.op() == token_type::andand && !to_boolean(l)) || (e.op() == token_type::oror && to_boolean(l))) {
            return l;
        }
        auto r = get_value(eval(e.rhs()));
        if (e.op() == token_type::andand || e.op() == token_type::oror) {
            return r;
        } else if (is_reference_op(e.op())) {
            return make_reference(l, r);
        } else if (e.op() == token_type::in_) {
            if (r.type() != value_type::object) {
                std::wostringstream woss;
                woss << r.type() << " is not an object";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
            return value{r.object_value()->has_property(to_string(heap_, l).view())};
        } else if (e.op() == token_type::instanceof_) {
            if (r.type() != value_type::object || r.object_value()->prototype().get() != global_->function_prototype().get()) {
                std::wostringstream woss;
                woss << r.type() << " is not an object";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
            // ES3, 15.3.5.3 [[HasInstance]] (only implemented for Function objects)
            if (l.type() != value_type::object) {
                return value{false};
            }
            auto o = r.object_value()->get(L"prototype");
            if (o.type() != value_type::object) {
                std::wostringstream woss;
                woss << "Function has non-object prototype of type " << o.type() << " in instanceof check";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
            auto v = l.object_value()->prototype();
            for (;;) {
                if (!v) {
                    return value{false};
                }
                if (v.get() == o.object_value().get()) { // TODO: handle joined objects (ES3, 13.1.2)
                    return value{true};
                }
                v = v->prototype();
            }

        }
        return do_binary_op(e.op(), l, r);
    }